

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateCommand.cxx
# Opt level: O3

cmCTestGenericHandler * __thiscall
cmCTestUpdateCommand::InitializeHandler(cmCTestUpdateCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCTest *pcVar2;
  cmMakefile *pcVar3;
  char *pcVar4;
  cmCTestGenericHandler *this_00;
  string source_dir;
  string local_88;
  allocator local_61;
  string local_60;
  string local_40;
  
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  pcVar4 = (this->super_cmCTestHandlerCommand).Values.
           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start[4];
  if (pcVar4 == (char *)0x0) {
    pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CTEST_SOURCE_DIRECTORY","")
    ;
    pcVar4 = cmMakefile::GetDefinition(pcVar3,&local_40);
    std::__cxx11::string::string((string *)&local_88,pcVar4,&local_61);
    cmsys::SystemTools::CollapseFullPath(&local_60,&local_88);
    cmCTest::SetCTestConfiguration
              (pcVar2,"SourceDirectory",local_60._M_dataplus._M_p,
               (this->super_cmCTestHandlerCommand).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    local_88._M_dataplus._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) goto LAB_002fbf0c;
  }
  else {
    std::__cxx11::string::string((string *)&local_88,pcVar4,(allocator *)&local_40);
    cmsys::SystemTools::CollapseFullPath(&local_60,&local_88);
    cmCTest::SetCTestConfiguration
              (pcVar2,"SourceDirectory",local_60._M_dataplus._M_p,
               (this->super_cmCTestHandlerCommand).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    local_40.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
LAB_002fbf0c:
      operator_delete(local_88._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"SourceDirectory","");
  cmCTest::GetCTestConfiguration(&local_60,pcVar2,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_UPDATE_COMMAND","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"UpdateCommand",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_UPDATE_OPTIONS","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"UpdateOptions",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_CVS_COMMAND","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"CVSCommand",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_CVS_UPDATE_OPTIONS","")
  ;
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"CVSUpdateOptions",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_SVN_COMMAND","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"SVNCommand",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_SVN_UPDATE_OPTIONS","")
  ;
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"SVNUpdateOptions",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_SVN_OPTIONS","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"SVNOptions",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_BZR_COMMAND","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"BZRCommand",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_BZR_UPDATE_OPTIONS","")
  ;
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"BZRUpdateOptions",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_GIT_COMMAND","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"GITCommand",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_GIT_UPDATE_OPTIONS","")
  ;
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"GITUpdateOptions",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"CTEST_GIT_INIT_SUBMODULES","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"GITInitSubmodules",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_GIT_UPDATE_CUSTOM","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"GITUpdateCustom",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"CTEST_UPDATE_VERSION_ONLY","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"UpdateVersionOnly",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_HG_COMMAND","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"HGCommand",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_HG_UPDATE_OPTIONS","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"HGUpdateOptions",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_P4_COMMAND","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"P4Command",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_P4_UPDATE_OPTIONS","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"P4UpdateOptions",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_P4_CLIENT","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"P4Client",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"CTEST_P4_OPTIONS","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar2,pcVar3,"P4Options",&local_88,(this->super_cmCTestHandlerCommand).Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  this_00 = cmCTest::GetInitializedHandler
                      ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"update");
  if (this_00 == (cmCTestGenericHandler *)0x0) {
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"internal CTest error. Cannot instantiate update handler","");
    cmCommand::SetError((cmCommand *)this,&local_88);
  }
  else {
    this_00->Command = (cmCTestCommand *)this;
    if (local_60._M_string_length != 0) {
      local_88._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"SourceDirectory","");
      cmCTestGenericHandler::SetOption(this_00,&local_88,local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      this_00->Quiet = (this->super_cmCTestHandlerCommand).Quiet;
      goto LAB_002fc684;
    }
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"source directory not specified. Please use SOURCE tag","");
    cmCommand::SetError((cmCommand *)this,&local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  this_00 = (cmCTestGenericHandler *)0x0;
LAB_002fc684:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return this_00;
}

Assistant:

cmCTestGenericHandler* cmCTestUpdateCommand::InitializeHandler()
{
  if (this->Values[ct_SOURCE]) {
    this->CTest->SetCTestConfiguration(
      "SourceDirectory",
      cmSystemTools::CollapseFullPath(this->Values[ct_SOURCE]).c_str(),
      this->Quiet);
  } else {
    this->CTest->SetCTestConfiguration(
      "SourceDirectory",
      cmSystemTools::CollapseFullPath(
        this->Makefile->GetDefinition("CTEST_SOURCE_DIRECTORY"))
        .c_str(),
      this->Quiet);
  }
  std::string source_dir =
    this->CTest->GetCTestConfiguration("SourceDirectory");

  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "UpdateCommand", "CTEST_UPDATE_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "UpdateOptions", "CTEST_UPDATE_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CVSCommand", "CTEST_CVS_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CVSUpdateOptions", "CTEST_CVS_UPDATE_OPTIONS",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "SVNCommand", "CTEST_SVN_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "SVNUpdateOptions", "CTEST_SVN_UPDATE_OPTIONS",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "SVNOptions", "CTEST_SVN_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "BZRCommand", "CTEST_BZR_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "BZRUpdateOptions", "CTEST_BZR_UPDATE_OPTIONS",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "GITCommand", "CTEST_GIT_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "GITUpdateOptions", "CTEST_GIT_UPDATE_OPTIONS",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "GITInitSubmodules", "CTEST_GIT_INIT_SUBMODULES",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "GITUpdateCustom", "CTEST_GIT_UPDATE_CUSTOM", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "UpdateVersionOnly", "CTEST_UPDATE_VERSION_ONLY",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "HGCommand", "CTEST_HG_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "HGUpdateOptions", "CTEST_HG_UPDATE_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "P4Command", "CTEST_P4_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "P4UpdateOptions", "CTEST_P4_UPDATE_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "P4Client", "CTEST_P4_CLIENT", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "P4Options", "CTEST_P4_OPTIONS", this->Quiet);

  cmCTestGenericHandler* handler =
    this->CTest->GetInitializedHandler("update");
  if (!handler) {
    this->SetError("internal CTest error. Cannot instantiate update handler");
    return CM_NULLPTR;
  }
  handler->SetCommand(this);
  if (source_dir.empty()) {
    this->SetError("source directory not specified. Please use SOURCE tag");
    return CM_NULLPTR;
  }
  handler->SetOption("SourceDirectory", source_dir.c_str());
  handler->SetQuiet(this->Quiet);
  return handler;
}